

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O0

void test_bhdct_get_lots_string_key(planck_unit_test_t *tc)

{
  int local_90;
  int local_8c;
  uint local_88;
  char local_81;
  int i;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  planck_unit_test_t *tc_local;
  
  memset(&local_81,0,9);
  bhdct_setup_string_key
            (tc,(ion_dictionary_handler_t *)&dict.handler,(ion_dictionary_t *)(key + 1),
             ion_fill_none);
  for (local_88 = 300; (int)local_88 < 1000; local_88 = local_88 + 0xf) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    local_8c = local_88 * 5;
    bhdct_insert(tc,(ion_dictionary_t *)(key + 1),&local_81,&local_8c,'\x01');
  }
  for (local_88 = 300; (int)local_88 < 1000; local_88 = local_88 + 0xf) {
    sprintf(&local_81,"k%d",(ulong)local_88);
    local_90 = local_88 * 5;
    bhdct_get(tc,(ion_dictionary_t *)(key + 1),&local_81,&local_90,'\0',1);
  }
  bhdct_takedown(tc,(ion_dictionary_t *)(key + 1));
  return;
}

Assistant:

void
test_bhdct_get_lots_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_none);

	int i;

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_insert(tc, &dict, key, IONIZE(i * 5, int), boolean_true);
	}

	for (i = 300; i < 1000; i += 15) {
		sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
		bhdct_get(tc, &dict, key, IONIZE(i * 5, int), err_ok, 1);
	}

	bhdct_takedown(tc, &dict);
}